

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O0

void __thiscall ReadGroupResolver::ReadGroupResolver(ReadGroupResolver *this)

{
  vector<ModelType,_std::allocator<ModelType>_> *in_RDI;
  uint16_t i;
  value_type *__x;
  vector<ModelType,_std::allocator<ModelType>_> *pvVar1;
  ModelType *this_00;
  size_type in_stack_ffffffffffffffd8;
  vector<ModelType,_std::allocator<ModelType>_> *in_stack_ffffffffffffffe0;
  ushort local_16;
  
  *(undefined4 *)
   &(in_RDI->super__Vector_base<ModelType,_std::allocator<ModelType>_>)._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<ModelType,_std::allocator<ModelType>_>)._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<ModelType,_std::allocator<ModelType>_>)._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(undefined2 *)
   ((long)&(in_RDI->super__Vector_base<ModelType,_std::allocator<ModelType>_>)._M_impl.
           super__Vector_impl_data._M_finish + 4) = 100;
  *(undefined2 *)
   ((long)&(in_RDI->super__Vector_base<ModelType,_std::allocator<ModelType>_>)._M_impl.
           super__Vector_impl_data._M_finish + 6) = 100;
  *(undefined1 *)
   &(in_RDI->super__Vector_base<ModelType,_std::allocator<ModelType>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&(in_RDI->super__Vector_base<ModelType,_std::allocator<ModelType>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this_00 = (ModelType *)(in_RDI + 1);
  std::vector<ModelType,_std::allocator<ModelType>_>::vector
            ((vector<ModelType,_std::allocator<ModelType>_> *)0x221a29);
  pvVar1 = in_RDI + 2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x221a3c);
  std::vector<ModelType,_std::allocator<ModelType>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  for (local_16 = 0; local_16 < 8; local_16 = local_16 + 1) {
    __x = (value_type *)(in_RDI + 1);
    ModelType::ModelType(this_00,(uint16_t)((ulong)pvVar1 >> 0x30));
    std::vector<ModelType,_std::allocator<ModelType>_>::push_back(in_RDI,__x);
    ModelType::~ModelType((ModelType *)0x221a9b);
  }
  return;
}

Assistant:

ReadGroupResolver::ReadGroupResolver()
    : MinFragmentLength(0)
    , MedianFragmentLength(0)
    , MaxFragmentLength(0)
    , TopModelId(ModelType::DUMMY_ID)
    , NextTopModelId(ModelType::DUMMY_ID)
    , IsAmbiguous(false)
    , HasData(false)
{
    // pre-allocate space for 8 models
    Models.reserve(NUM_MODELS);
    for (uint16_t i = 0; i < NUM_MODELS; ++i)
        Models.push_back(ModelType(i + 1));
}